

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<pstore::typed_address<pstore::indirect_string>,_void> * __thiscall
pstore::maybe<pstore::typed_address<pstore::indirect_string>,void>::operator=
          (maybe<pstore::typed_address<pstore::indirect_string>,void> *this,
          typed_address<pstore::indirect_string> *other)

{
  value_type vVar1;
  typed_address<pstore::indirect_string> *ptVar2;
  
  if (*this == (maybe<pstore::typed_address<pstore::indirect_string>,void>)0x1) {
    vVar1 = (other->a_).a_;
    ptVar2 = value_impl<pstore::maybe<pstore::typed_address<pstore::indirect_string>,void>&,pstore::typed_address<pstore::indirect_string>>
                       ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)this);
    (ptVar2->a_).a_ = vVar1;
  }
  else {
    *(value_type *)(this + 8) = (other->a_).a_;
    *this = (maybe<pstore::typed_address<pstore::indirect_string>,void>)0x1;
  }
  return (maybe<pstore::typed_address<pstore::indirect_string>,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }